

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O0

shared_ptr<const_tchecker::typed_lvalue_expression_t> __thiscall
tchecker::typed_diagonal_clkconstr_expression_t::first_clock_ptr
          (typed_diagonal_clkconstr_expression_t *this)

{
  typed_expression_t *ptVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  typed_binary_expression_t *in_RSI;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> sVar2;
  undefined1 local_30 [24];
  typed_binary_expression_t *diagonal;
  typed_diagonal_clkconstr_expression_t *this_local;
  
  this_local = this;
  ptVar1 = typed_binary_expression_t::left_operand(in_RSI);
  local_30._16_8_ =
       __dynamic_cast(ptVar1,&typed_expression_t::typeinfo,&typed_binary_expression_t::typeinfo,0);
  if (local_30._16_8_ == 0) {
    __cxa_bad_cast();
  }
  typed_binary_expression_t::left_operand_ptr((typed_binary_expression_t *)local_30);
  std::
  dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::typed_expression_t_const>
            ((shared_ptr<const_tchecker::typed_expression_t> *)this);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)local_30);
  sVar2.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_tchecker::typed_lvalue_expression_t>)
         sVar2.
         super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_lvalue_expression_t const> typed_diagonal_clkconstr_expression_t::first_clock_ptr() const
{
  auto const & diagonal = dynamic_cast<tchecker::typed_binary_expression_t const &>(left_operand()); // left expr is x - y
  return std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(diagonal.left_operand_ptr());
}